

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRailing::~IfcRailing(IfcRailing *this)

{
  *(undefined8 *)&this[-1].field_0x50 = 0x91a678;
  *(undefined8 *)&this->field_0x38 = 0x91a790;
  *(undefined8 *)&this[-1].field_0xd8 = 0x91a6a0;
  *(undefined8 *)&this[-1].field_0xe8 = 0x91a6c8;
  *(undefined8 *)&this[-1].field_0x120 = 0x91a6f0;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x91a718;
  *(undefined8 *)&this[-1].field_0x188 = 0x91a740;
  *(undefined8 *)this = 0x91a768;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x50,&PTR_construction_vtable_24__0091a7b0);
  operator_delete(&this[-1].field_0x50,0x198);
  return;
}

Assistant:

IfcRailing() : Object("IfcRailing") {}